

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_plm.cpp
# Opt level: O3

void PLM::PredictVelOnXFace
               (Box *xebox,int ncomp,Array4<double> *Imx,Array4<double> *Ipx,Array4<const_double> *q
               ,Array4<const_double> *vcc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  double dVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  pair<bool,_bool> pVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  double *pdVar42;
  int iVar43;
  double *pdVar44;
  int iVar45;
  long lVar46;
  uint uVar47;
  long lVar48;
  long lVar49;
  double *pdVar50;
  int iVar51;
  bool bVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar61;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar70;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar71;
  double dVar72;
  double dVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  double dVar76;
  double dVar77;
  Real qm;
  BCRec *bc;
  ulong local_270;
  long local_258;
  double *local_240;
  double *local_1e0;
  double *local_1d8;
  double local_1b8;
  ulong local_1a8;
  double *local_100;
  double *local_f8;
  double *local_f0;
  
  dVar53 = dt / (geom->super_CoordSys).dx[0];
  iVar2 = (geom->domain).smallend.vect[0];
  iVar3 = (geom->domain).bigend.vect[0];
  pVar33 = anon_unknown.dwarf_4c2856::has_extdir_or_ho
                     ((h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start,ncomp,0);
  if (((((ushort)pVar33 & 1) == 0) || (iVar2 < (xebox->smallend).vect[0] + -1)) &&
     (iVar4 = (xebox->bigend).vect[0], iVar4 < iVar3 || ((ushort)pVar33 >> 8 & 1) == 0)) {
    if (0 < ncomp) {
      lVar16 = Ipx->jstride;
      lVar17 = Imx->jstride;
      iVar2 = (xebox->smallend).vect[1];
      lVar46 = (long)iVar2;
      iVar3 = (xebox->smallend).vect[0];
      lVar48 = (long)iVar3;
      iVar5 = (vcc->begin).y;
      local_1d8 = Ipx->p + (((lVar46 - (Ipx->begin).y) * lVar16 + lVar48 + -1) -
                           (long)(Ipx->begin).x);
      lVar18 = vcc->jstride;
      iVar6 = (vcc->begin).x;
      lVar49 = (long)(q->begin).y;
      lVar19 = q->jstride;
      iVar7 = (q->begin).x;
      iVar51 = iVar3 - iVar7;
      pdVar20 = q->p;
      lVar21 = q->kstride;
      lVar22 = q->nstride;
      iVar8 = (q->begin).z;
      pdVar23 = vcc->p;
      lVar24 = vcc->kstride;
      iVar9 = (vcc->begin).z;
      lVar25 = Ipx->kstride;
      lVar26 = Ipx->nstride;
      iVar10 = (Ipx->begin).z;
      local_240 = Imx->p + (((lVar46 - (Imx->begin).y) * lVar17 + lVar48) - (long)(Imx->begin).x);
      lVar27 = Imx->kstride;
      lVar28 = Imx->nstride;
      iVar11 = (Imx->begin).z;
      iVar12 = (xebox->smallend).vect[2];
      iVar13 = (xebox->bigend).vect[1];
      iVar14 = (xebox->bigend).vect[2];
      local_1e0 = pdVar20 + (((lVar46 - lVar49) * lVar19 + lVar48 + -1) - (long)iVar7);
      local_270 = 0;
      do {
        if (iVar12 <= iVar14) {
          lVar35 = local_270 * lVar22;
          iVar7 = iVar12;
          do {
            if (iVar2 <= iVar13) {
              lVar36 = (long)iVar7;
              pdVar44 = (double *)((lVar36 - iVar11) * lVar27 * 8 + (long)local_240);
              pdVar42 = (double *)((lVar36 - iVar10) * lVar25 * 8 + (long)local_1d8);
              lVar41 = (long)pdVar23 +
                       (lVar36 - iVar9) * lVar24 * 8 +
                       lVar48 * 8 + (lVar46 - iVar5) * lVar18 * 8 + (long)iVar6 * -8;
              pdVar50 = (double *)((lVar36 - iVar8) * lVar21 * 8 + (long)local_1e0);
              lVar37 = (iVar7 - iVar8) * lVar21;
              lVar36 = lVar46;
              do {
                if (iVar3 <= iVar4) {
                  lVar38 = (lVar36 - lVar49) * lVar19;
                  lVar40 = 0;
                  do {
                    iVar39 = (int)lVar40;
                    dVar55 = pdVar50[lVar40];
                    dVar77 = (pdVar50 + lVar40)[1];
                    dVar73 = dVar55 - pdVar20[lVar35 + lVar37 + lVar38 + (iVar51 + -2 + iVar39)];
                    dVar29 = dVar77 - dVar55;
                    dVar65 = 0.0;
                    dVar67 = ABS(dVar73);
                    dVar70 = ABS(dVar29);
                    dVar62 = 0.0;
                    if (0.0 <= dVar29 * dVar73) {
                      dVar62 = dVar70;
                      if (dVar67 <= dVar70) {
                        dVar62 = dVar67;
                      }
                      dVar62 = dVar62 + dVar62;
                    }
                    dVar57 = pdVar20[lVar35 + lVar37 + lVar38 + (iVar51 + 2 + iVar39)] -
                             pdVar20[lVar35 + lVar37 + lVar38 + (iVar51 + iVar39 + 1)];
                    dVar61 = pdVar20[lVar35 + lVar37 + lVar38 + (iVar51 + iVar39 + 1)] - dVar77;
                    if (0.0 <= dVar61 * dVar57) {
                      dVar65 = ABS(dVar57);
                      if (ABS(dVar61) <= ABS(dVar57)) {
                        dVar65 = ABS(dVar61);
                      }
                      dVar65 = dVar65 + dVar65;
                    }
                    dVar56 = 0.0;
                    dVar63 = 0.0;
                    if (0.0 <= dVar61 * dVar29) {
                      dVar63 = ABS(dVar61);
                      if (ABS(dVar29) <= ABS(dVar61)) {
                        dVar63 = ABS(dVar29);
                      }
                      dVar63 = dVar63 + dVar63;
                    }
                    dVar58 = pdVar20[lVar35 + lVar37 + lVar38 + (iVar51 + -2 + iVar39)] -
                             pdVar20[lVar35 + lVar37 + lVar38 + (iVar51 + -3 + iVar39)];
                    if (0.0 <= dVar73 * dVar58) {
                      dVar56 = ABS(dVar73);
                      if (ABS(dVar58) <= ABS(dVar73)) {
                        dVar56 = ABS(dVar58);
                      }
                      dVar56 = dVar56 + dVar56;
                    }
                    dVar72 = 0.0;
                    dVar76 = 0.0;
                    if (0.0 <= dVar61 * dVar29) {
                      dVar76 = ABS(dVar61);
                      if (ABS(dVar29) <= ABS(dVar61)) {
                        dVar76 = ABS(dVar29);
                      }
                      dVar76 = dVar76 + dVar76;
                    }
                    if (0.0 <= dVar29 * dVar73) {
                      if (dVar67 <= dVar70) {
                        dVar70 = dVar67;
                      }
                      dVar72 = dVar70 + dVar70;
                    }
                    dVar67 = (dVar58 + dVar73) * 0.5;
                    dVar58 = (dVar61 + dVar29) * 0.5;
                    auVar68._0_8_ = ABS(dVar67);
                    auVar68._8_8_ = ABS(dVar58);
                    auVar69._8_8_ = dVar76;
                    auVar69._0_8_ = dVar56;
                    auVar69 = minpd(auVar68,auVar69);
                    dVar70 = *(double *)(lVar41 + lVar40 * 8);
                    dVar73 = (dVar73 + dVar29) * 0.5;
                    dVar29 = (dVar57 + dVar61) * 0.5;
                    dVar57 = (double)((ulong)dVar73 & 0x8000000000000000 | 0x3ff0000000000000);
                    auVar59._0_8_ = ABS(dVar73);
                    auVar59._8_8_ = ABS(dVar29);
                    auVar60._8_4_ = SUB84(dVar65,0);
                    auVar60._0_8_ = dVar62;
                    auVar60._12_4_ = (int)((ulong)dVar65 >> 0x20);
                    auVar60 = minpd(auVar59,auVar60);
                    dVar29 = ABS(dVar58 * 1.3333333333333333 +
                                 (auVar60._8_8_ *
                                  (double)((ulong)dVar29 & 0x8000000000000000 | 0x3ff0000000000000)
                                 + auVar60._0_8_ * dVar57) * -0.16666666666666666);
                    if (dVar63 <= dVar29) {
                      dVar29 = dVar63;
                    }
                    dVar62 = (double)((ulong)dVar58 & 0x8000000000000000 | 0x3ff0000000000000);
                    dVar73 = ABS(dVar73 * 1.3333333333333333 +
                                 (auVar69._8_8_ * dVar62 +
                                 auVar69._0_8_ *
                                 (double)((ulong)dVar67 & 0x8000000000000000 | 0x3ff0000000000000))
                                 * -0.16666666666666666);
                    if (dVar72 <= dVar73) {
                      dVar73 = dVar72;
                    }
                    pdVar42[lVar40] =
                         dVar73 * dVar57 *
                         (1.0 - *(double *)(lVar41 + -8 + lVar40 * 8) * dVar53) * 0.5 + dVar55;
                    pdVar44[lVar40] = dVar77 + dVar62 * dVar29 * (-1.0 - dVar70 * dVar53) * 0.5;
                    lVar40 = lVar40 + 1;
                  } while ((iVar4 - iVar3) + 1 != (int)lVar40);
                }
                lVar36 = lVar36 + 1;
                pdVar44 = pdVar44 + lVar17;
                pdVar42 = pdVar42 + lVar16;
                lVar41 = lVar41 + lVar18 * 8;
                pdVar50 = pdVar50 + lVar19;
              } while (iVar13 + 1 != (int)lVar36);
            }
            bVar52 = iVar7 != iVar14;
            iVar7 = iVar7 + 1;
          } while (bVar52);
        }
        local_270 = local_270 + 1;
        local_240 = local_240 + lVar28;
        local_1d8 = local_1d8 + lVar26;
        local_1e0 = local_1e0 + lVar22;
      } while (local_270 != (uint)ncomp);
    }
  }
  else if (0 < ncomp) {
    lVar16 = Imx->jstride;
    lVar17 = Ipx->jstride;
    iVar4 = (xebox->smallend).vect[1];
    lVar48 = (long)iVar4;
    iVar5 = (xebox->smallend).vect[0];
    lVar35 = (long)iVar5;
    iVar6 = (vcc->begin).y;
    local_f8 = Ipx->p + (((lVar48 - (Ipx->begin).y) * lVar17 + lVar35 + -1) - (long)(Ipx->begin).x);
    lVar18 = vcc->jstride;
    iVar7 = (vcc->begin).x;
    lVar46 = (long)(q->begin).y;
    lVar19 = q->jstride;
    uVar15 = (q->begin).x;
    iVar45 = iVar2 - uVar15;
    iVar39 = iVar3 - uVar15;
    local_f0 = Imx->p + (((lVar48 - (Imx->begin).y) * lVar16 + lVar35) - (long)(Imx->begin).x);
    iVar43 = iVar5 - uVar15;
    pdVar20 = q->p;
    lVar21 = q->kstride;
    lVar22 = q->nstride;
    iVar8 = (q->begin).z;
    pdVar23 = vcc->p;
    lVar24 = vcc->kstride;
    iVar9 = (vcc->begin).z;
    lVar25 = Imx->kstride;
    lVar26 = Imx->nstride;
    iVar10 = (Imx->begin).z;
    lVar27 = Ipx->kstride;
    lVar28 = Ipx->nstride;
    iVar11 = (Ipx->begin).z;
    iVar12 = (xebox->smallend).vect[2];
    iVar13 = (xebox->bigend).vect[2];
    iVar14 = (xebox->bigend).vect[0];
    iVar51 = (xebox->bigend).vect[1];
    lVar49 = (long)(int)(iVar2 + ~uVar15);
    local_100 = pdVar20 + (((lVar48 - lVar46) * lVar19 + lVar35 + -1) - (long)(int)uVar15);
    local_1a8 = 0;
    do {
      if (iVar12 <= iVar13) {
        lVar36 = local_1a8 * lVar22;
        iVar32 = iVar12;
        do {
          if (iVar4 <= iVar51) {
            lVar37 = (long)iVar32;
            pdVar50 = (double *)((lVar37 - iVar10) * lVar25 * 8 + (long)local_f0);
            pdVar44 = (double *)((lVar37 - iVar11) * lVar27 * 8 + (long)local_f8);
            lVar41 = (long)pdVar23 +
                     (lVar37 - iVar9) * lVar24 * 8 +
                     lVar35 * 8 + (lVar48 - iVar6) * lVar18 * 8 + (long)iVar7 * -8;
            pdVar42 = (double *)((lVar37 - iVar8) * lVar21 * 8 + (long)local_100);
            lVar37 = (iVar32 - iVar8) * lVar21;
            local_258 = lVar48;
            do {
              if (iVar5 <= iVar14) {
                uVar34 = pbc[local_1a8].bc[0] - 3;
                uVar47 = pbc[local_1a8].bc[3] - 3;
                lVar38 = (local_258 - lVar46) * lVar19;
                lVar40 = 0;
                do {
                  iVar30 = (int)lVar40;
                  dVar73 = pdVar20[lVar38 + lVar37 + lVar36 + (iVar43 + -2 + iVar30)];
                  dVar29 = SUB168(*(undefined1 (*) [16])(pdVar42 + lVar40),0);
                  dVar62 = SUB168(*(undefined1 (*) [16])(pdVar42 + lVar40),8);
                  dVar67 = dVar29 - dVar73;
                  dVar57 = dVar62 - dVar29;
                  dVar77 = 0.0;
                  dVar61 = (dVar57 + dVar67) * 0.5;
                  dVar70 = ABS(dVar67);
                  dVar55 = ABS(dVar57);
                  dVar65 = 0.0;
                  if (0.0 <= dVar57 * dVar67) {
                    dVar65 = dVar55;
                    if (dVar70 <= dVar55) {
                      dVar65 = dVar70;
                    }
                    dVar65 = dVar65 + dVar65;
                  }
                  dVar63 = pdVar20[lVar38 + lVar37 + lVar36 + (iVar43 + iVar30 + 1)];
                  dVar58 = pdVar20[lVar38 + lVar37 + lVar36 + (iVar43 + 2 + iVar30)] - dVar63;
                  dVar76 = dVar63 - dVar62;
                  dVar56 = (dVar76 + dVar58) * 0.5;
                  if (0.0 <= dVar76 * dVar58) {
                    dVar77 = ABS(dVar58);
                    if (ABS(dVar76) <= ABS(dVar58)) {
                      dVar77 = ABS(dVar76);
                    }
                    dVar77 = dVar77 + dVar77;
                  }
                  dVar58 = (dVar57 + dVar76) * 0.5;
                  local_1b8 = 0.0;
                  if (0.0 <= dVar57 * dVar76) {
                    local_1b8 = ABS(dVar76);
                    if (ABS(dVar57) <= ABS(dVar76)) {
                      local_1b8 = ABS(dVar57);
                    }
                    local_1b8 = local_1b8 + local_1b8;
                  }
                  dVar64 = (double)((ulong)dVar61 & 0x8000000000000000 | 0x3ff0000000000000);
                  dVar72 = ABS(dVar61);
                  if (dVar65 <= ABS(dVar61)) {
                    dVar72 = dVar65;
                  }
                  dVar72 = dVar72 * dVar64;
                  dVar65 = (double)((ulong)dVar58 & 0x8000000000000000 | 0x3ff0000000000000);
                  uVar31 = (ulong)DAT_00753000;
                  if ((uVar34 < 2) && (iVar2 - lVar35 == lVar40)) {
                    local_1b8 = 0.0;
                    if (0.0 <= (dVar57 + dVar57) * (dVar76 + dVar76)) {
                      local_1b8 = ABS(dVar76 + dVar76);
                      dVar77 = ABS(dVar57 + dVar57);
                      if (dVar77 <= local_1b8) {
                        local_1b8 = dVar77;
                      }
                    }
                    dVar56 = pdVar20[lVar38 + lVar37 + lVar36 + (iVar43 + 2 + iVar30)] * -0.1 +
                             dVar63 * 0.6666666666666666 +
                             dVar29 * -1.0666666666666667 + dVar62 * 0.5;
                    dVar77 = (double)((ulong)dVar56 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  else {
                    dVar1 = ABS(dVar56);
                    if (dVar77 <= dVar1) {
                      dVar1 = dVar77;
                    }
                    dVar1 = dVar1 * (double)((ulong)dVar56 & 0x8000000000000000 | uVar31);
                    dVar56 = dVar58 * 1.3333333333333333 + (dVar72 + dVar1) * -0.16666666666666666;
                    dVar77 = dVar65;
                    if ((uVar34 < 2) && ((iVar2 + 1) - lVar35 == lVar40)) {
                      dVar56 = pdVar20[lVar38 + lVar37 + iVar45 + lVar36];
                      dVar66 = dVar56 - pdVar20[lVar38 + lVar37 + lVar49 + lVar36];
                      dVar72 = (dVar62 - dVar56) + (dVar62 - dVar56);
                      dVar66 = dVar66 + dVar66;
                      dVar71 = 0.0;
                      if (0.0 <= dVar66 * dVar72) {
                        dVar71 = ABS(dVar72);
                        dVar66 = ABS(dVar66);
                        if (dVar66 <= dVar71) {
                          dVar71 = dVar66;
                        }
                      }
                      dVar56 = pdVar20[lVar38 + lVar37 + (iVar45 + 2) + lVar36] * -0.1 +
                               dVar62 * 0.6666666666666666 +
                               pdVar20[lVar38 + lVar37 + lVar49 + lVar36] * -1.0666666666666667 +
                               dVar56 * 0.5;
                      dVar72 = ABS(dVar56);
                      if (dVar71 <= dVar72) {
                        dVar72 = dVar71;
                      }
                      dVar72 = dVar72 * (double)((ulong)dVar56 & 0x8000000000000000 | uVar31);
                      dVar56 = dVar58 * 1.3333333333333333 + (dVar1 + dVar72) * -0.16666666666666666
                      ;
                    }
                  }
                  dVar1 = *(double *)(lVar41 + lVar40 * 8);
                  bVar52 = iVar3 - lVar35 != lVar40;
                  if (bVar52 || 1 < uVar47) {
                    if ((uVar47 < 2) && ((iVar3 + -1) - lVar35 == lVar40)) {
                      dVar56 = pdVar20[lVar38 + lVar37 + iVar39 + lVar36];
                      dVar71 = pdVar20[lVar38 + lVar37 + (iVar39 + 1) + lVar36] - dVar56;
                      dVar71 = dVar71 + dVar71;
                      dVar54 = (dVar56 - dVar62) + (dVar56 - dVar62);
                      dVar66 = 0.0;
                      if (0.0 <= dVar54 * dVar71) {
                        dVar66 = ABS(dVar71);
                        dVar54 = ABS(dVar54);
                        if (dVar54 <= dVar66) {
                          dVar66 = dVar54;
                        }
                      }
                      dVar71 = pdVar20[lVar38 + lVar37 + (iVar39 + -2) + lVar36] * 0.1 +
                               dVar62 * -0.6666666666666666 +
                               pdVar20[lVar38 + lVar37 + (iVar39 + 1) + lVar36] * 1.0666666666666667
                               + dVar56 * -0.5;
                      dVar56 = ABS(dVar71);
                      if (dVar66 <= dVar56) {
                        dVar56 = dVar66;
                      }
                      dVar56 = dVar58 * 1.3333333333333333 +
                               (dVar72 + dVar56 * (double)((ulong)dVar71 & 0x8000000000000000 |
                                                          uVar31)) * -0.16666666666666666;
                    }
                  }
                  else {
                    local_1b8 = 0.0;
                    if (0.0 <= (dVar57 + dVar57) * (dVar76 + dVar76)) {
                      local_1b8 = ABS(dVar76 + dVar76);
                      dVar77 = ABS(dVar57 + dVar57);
                      if (dVar77 <= local_1b8) {
                        local_1b8 = dVar77;
                      }
                    }
                    dVar56 = dVar73 * 0.1 +
                             dVar29 * -0.6666666666666666 +
                             dVar63 * 1.0666666666666667 + dVar62 * -0.5;
                    dVar77 = (double)((ulong)dVar56 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  dVar54 = dVar73 - pdVar20[lVar38 + lVar37 + lVar36 + (iVar43 + -3 + iVar30)];
                  dVar72 = (dVar67 + dVar54) * 0.5;
                  dVar71 = 0.0;
                  dVar66 = 0.0;
                  if (0.0 <= dVar67 * dVar54) {
                    dVar66 = ABS(dVar67);
                    if (ABS(dVar54) <= ABS(dVar67)) {
                      dVar66 = ABS(dVar54);
                    }
                    dVar66 = dVar66 + dVar66;
                  }
                  if (0.0 <= dVar57 * dVar76) {
                    dVar71 = ABS(dVar76);
                    if (ABS(dVar57) <= ABS(dVar76)) {
                      dVar71 = ABS(dVar57);
                    }
                    dVar71 = dVar71 + dVar71;
                  }
                  dVar54 = 0.0;
                  if (0.0 <= dVar57 * dVar67) {
                    if (dVar70 <= dVar55) {
                      dVar55 = dVar70;
                    }
                    dVar54 = dVar55 + dVar55;
                  }
                  dVar55 = ABS(dVar72);
                  if (dVar66 <= dVar55) {
                    dVar55 = dVar66;
                  }
                  dVar55 = dVar55 * (double)((ulong)dVar72 & 0x8000000000000000 | uVar31);
                  if ((uVar34 < 2) && ((iVar2 - iVar5) + 1 == iVar30)) {
                    dVar54 = 0.0;
                    if (0.0 <= (dVar57 + dVar57) * (dVar67 + dVar67)) {
                      dVar65 = ABS(dVar67 + dVar67);
                      dVar54 = ABS(dVar57 + dVar57);
                      if (dVar65 <= dVar54) {
                        dVar54 = dVar65;
                      }
                    }
                    dVar58 = dVar63 * -0.1 +
                             dVar62 * 0.6666666666666666 +
                             dVar73 * -1.0666666666666667 + dVar29 * 0.5;
                    dVar64 = (double)((ulong)dVar58 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  else {
                    dVar70 = ABS(dVar58);
                    if (dVar71 <= ABS(dVar58)) {
                      dVar70 = dVar71;
                    }
                    dVar58 = dVar61 * 1.3333333333333333 +
                             (dVar55 + dVar65 * dVar70) * -0.16666666666666666;
                    if ((uVar34 < 2) && ((iVar2 - iVar5) + 2 == iVar30)) {
                      dVar55 = pdVar20[lVar38 + lVar37 + iVar45 + lVar36];
                      dVar72 = dVar55 - pdVar20[lVar38 + lVar37 + lVar49 + lVar36];
                      dVar58 = (dVar29 - dVar55) + (dVar29 - dVar55);
                      dVar72 = dVar72 + dVar72;
                      uVar74 = 0;
                      uVar75 = 0;
                      if (0.0 <= dVar72 * dVar58) {
                        dVar58 = ABS(dVar58);
                        dVar72 = ABS(dVar72);
                        if (dVar72 <= dVar58) {
                          dVar58 = dVar72;
                        }
                        uVar74 = SUB84(dVar58,0);
                        uVar75 = (undefined4)((ulong)dVar58 >> 0x20);
                      }
                      dVar58 = pdVar20[lVar38 + lVar37 + (iVar45 + 2) + lVar36] * -0.1 +
                               dVar29 * 0.6666666666666666 +
                               pdVar20[lVar38 + lVar37 + lVar49 + lVar36] * -1.0666666666666667 +
                               dVar55 * 0.5;
                      dVar55 = ABS(dVar58);
                      if ((double)CONCAT44(uVar75,uVar74) <= dVar55) {
                        dVar55 = (double)CONCAT44(uVar75,uVar74);
                      }
                      dVar55 = dVar55 * (double)((ulong)dVar58 & 0x8000000000000000 | uVar31);
                      dVar58 = dVar61 * 1.3333333333333333 +
                               (dVar65 * dVar70 + dVar55) * -0.16666666666666666;
                    }
                  }
                  if ((uVar47 < 2) && ((iVar3 - iVar5) + 1 == iVar30)) {
                    dVar54 = 0.0;
                    if (0.0 <= (dVar57 + dVar57) * (dVar67 + dVar67)) {
                      dVar55 = ABS(dVar67 + dVar67);
                      dVar54 = ABS(dVar57 + dVar57);
                      if (dVar55 <= dVar54) {
                        dVar54 = dVar55;
                      }
                    }
                    dVar58 = pdVar20[lVar38 + lVar37 + lVar36 + (iVar43 + -3 + iVar30)] * 0.1 +
                             dVar73 * -0.6666666666666666 +
                             dVar62 * 1.0666666666666667 + dVar29 * -0.5;
                    dVar64 = (double)((ulong)dVar58 & 0x8000000000000000 | 0x3ff0000000000000);
                  }
                  else if (!bVar52 && 1 >= uVar47) {
                    dVar70 = dVar62 - pdVar20[lVar38 + lVar37 + lVar36 + (int)(~uVar15 + iVar3)];
                    dVar70 = dVar70 + dVar70;
                    dVar65 = 0.0;
                    if (0.0 <= dVar70 * (dVar76 + dVar76)) {
                      dVar65 = ABS(dVar76 + dVar76);
                      dVar70 = ABS(dVar70);
                      if (dVar70 <= dVar65) {
                        dVar65 = dVar70;
                      }
                    }
                    dVar73 = dVar73 * 0.1 +
                             pdVar20[lVar38 + lVar37 + lVar36 + (int)(~uVar15 + iVar3)] *
                             -0.6666666666666666 + dVar63 * 1.0666666666666667 + dVar62 * -0.5;
                    dVar70 = ABS(dVar73);
                    if (dVar65 <= dVar70) {
                      dVar70 = dVar65;
                    }
                    dVar58 = dVar61 * 1.3333333333333333 +
                             (dVar55 + dVar70 * (double)((ulong)dVar73 & 0x8000000000000000 | uVar31
                                                        )) * -0.16666666666666666;
                  }
                  dVar73 = ABS(dVar56);
                  if (local_1b8 <= ABS(dVar56)) {
                    dVar73 = local_1b8;
                  }
                  dVar55 = ABS(dVar58);
                  if (dVar54 <= ABS(dVar58)) {
                    dVar55 = dVar54;
                  }
                  pdVar44[lVar40] =
                       dVar55 * dVar64 *
                       (1.0 - *(double *)(lVar41 + -8 + lVar40 * 8) * dVar53) * 0.5 + dVar29;
                  pdVar50[lVar40] = dVar77 * dVar73 * (-1.0 - dVar1 * dVar53) * 0.5 + dVar62;
                  lVar40 = lVar40 + 1;
                } while ((iVar14 - iVar5) + 1 != (int)lVar40);
              }
              local_258 = local_258 + 1;
              pdVar50 = pdVar50 + lVar16;
              pdVar44 = pdVar44 + lVar17;
              lVar41 = lVar41 + lVar18 * 8;
              pdVar42 = pdVar42 + lVar19;
            } while (iVar51 + 1 != (int)local_258);
          }
          bVar52 = iVar32 != iVar13;
          iVar32 = iVar32 + 1;
        } while (bVar52);
      }
      local_1a8 = local_1a8 + 1;
      local_f0 = local_f0 + lVar26;
      local_f8 = local_f8 + lVar28;
      local_100 = local_100 + lVar22;
    } while (local_1a8 != (uint)ncomp);
  }
  return;
}

Assistant:

void
PLM::PredictVelOnXFace ( Box const& xebox, int ncomp,
                         Array4<Real> const& Imx, Array4<Real> const& Ipx,
                         Array4<Real const> const& q,
                         Array4<Real const> const& vcc,
                         const Geometry& geom,
                         Real dt,
                         Vector<BCRec> const& h_bcrec,
                         BCRec const* pbc)
{
    const Real dx = geom.CellSize(0);
    const Real dtdx = dt/dx;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_ilo >= xebox.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi && domain_ihi <= xebox.bigEnd(0)))
    {
        amrex::ParallelFor(xebox, ncomp, [q,vcc,domain_ilo,domain_ihi,Imx,Ipx,dtdx,pbc]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            const auto& bc = pbc[n];
            bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                    (bc.lo(0) == BCType::hoextrap);
            bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                    (bc.hi(0) == BCType::hoextrap);

            int order = 4;

            Real upls = q(i  ,j,k,n) + 0.5 * (-1.0 - vcc(i  ,j,k,0) * dtdx) *
                amrex_calc_xslope_extdir(i  ,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);
            Real umns = q(i-1,j,k,n) + 0.5 * ( 1.0 - vcc(i-1,j,k,0) * dtdx) *
                amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

            Ipx(i-1,j,k,n) = umns;
            Imx(i  ,j,k,n) = upls;
        });
    }
    else
    {
        amrex::ParallelFor(xebox, ncomp, [q,vcc,Ipx,Imx,dtdx]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            int order = 4;

            Real upls = q(i  ,j,k,n) + 0.5 * (-1.0 - vcc(i  ,j,k,0) * dtdx) *
                amrex_calc_xslope(i  ,j,k,n,order,q);
            Real umns = q(i-1,j,k,n) + 0.5 * ( 1.0 - vcc(i-1,j,k,0) * dtdx) *
                amrex_calc_xslope(i-1,j,k,n,order,q);

            Ipx(i-1,j,k,n) = umns;
            Imx(i  ,j,k,n) = upls;
        });
    }
}